

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x12_conv.cpp
# Opt level: O3

precise_unit units::dod_unit(string *dod_string)

{
  char *__s2;
  int iVar1;
  double dVar2;
  undefined1 *puVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar6;
  double dVar7;
  precise_unit pVar8;
  ulong uVar5;
  
  __s2 = (dod_string->_M_dataplus)._M_p;
  puVar3 = dod_units;
  uVar5 = 0x1e6;
  do {
    uVar4 = uVar5 >> 1;
    iVar1 = strcmp(*(char **)((long)puVar3 + (uVar4 * 4 + 3) * 8),__s2);
    uVar6 = uVar4;
    if (iVar1 < 0) {
      uVar6 = ~uVar4 + uVar5;
      puVar3 = (undefined1 *)((long)puVar3 + (uVar4 * 4 + 4) * 8);
    }
    uVar5 = uVar6;
  } while (0 < (long)uVar6);
  iVar1 = strcmp(*(char **)((long)puVar3 + 0x18),__s2);
  if (iVar1 == 0) {
    dVar7 = *(double *)puVar3;
    dVar2 = *(double *)((long)puVar3 + 8);
  }
  else {
    dVar2 = 2.07707442941207e-314;
    dVar7 = 1.0;
  }
  pVar8._8_8_ = dVar2;
  pVar8.multiplier_ = dVar7;
  return pVar8;
}

Assistant:

precise_unit dod_unit(const std::string& dod_string)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto ind = std::lower_bound(
        dod_units.begin(),
        dod_units.end(),
        dod_string,
        [](const unitD& u_set, const std::string& val) {
            return (strcmp(std::get<0>(u_set), val.c_str()) < 0);
        });
    if (strcmp(std::get<0>(*ind), dod_string.c_str()) == 0) {
        return std::get<2>(*ind);
    }
    return precise::error;
}